

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O3

void __thiscall
amrex::STLtools::updateIntercept
          (STLtools *this,Array<Array4<Real>,_3> *inter_arr,
          Array<Array4<const_EB2::Type_t>,_3> *type_arr,Array4<const_double> *lst,Geometry *geom)

{
  Real RVar1;
  Real RVar2;
  Real RVar3;
  Real RVar4;
  Real RVar5;
  Real RVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  double *pdVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  long lVar23;
  long lVar24;
  uint *puVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  bool bVar32;
  long lVar33;
  bool bVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  Real RVar46;
  Real RVar47;
  
  RVar1 = (geom->super_CoordSys).dx[0];
  RVar2 = (geom->super_CoordSys).dx[1];
  RVar3 = (geom->super_CoordSys).dx[2];
  RVar4 = (geom->prob_domain).xlo[0];
  RVar5 = (geom->prob_domain).xlo[1];
  RVar6 = (geom->prob_domain).xlo[2];
  pdVar19 = lst->p;
  iVar8 = (lst->begin).x;
  lVar40 = (long)(lst->begin).y;
  iVar9 = (lst->begin).z;
  lVar39 = lst->kstride * 8;
  lVar36 = lst->jstride * 8;
  lVar42 = 0;
  do {
    iVar10 = inter_arr->_M_elems[lVar42].begin.z;
    iVar11 = inter_arr->_M_elems[lVar42].end.z;
    if (iVar10 < iVar11) {
      iVar12 = inter_arr->_M_elems[lVar42].end.x;
      iVar13 = inter_arr->_M_elems[lVar42].end.y;
      lVar20 = type_arr->_M_elems[lVar42].jstride;
      lVar21 = type_arr->_M_elems[lVar42].kstride;
      iVar14 = type_arr->_M_elems[lVar42].begin.z;
      pdVar22 = inter_arr->_M_elems[lVar42].p;
      lVar23 = inter_arr->_M_elems[lVar42].jstride;
      lVar24 = inter_arr->_M_elems[lVar42].kstride;
      iVar15 = type_arr->_M_elems[lVar42].begin.y;
      iVar16 = type_arr->_M_elems[lVar42].begin.x;
      iVar17 = inter_arr->_M_elems[lVar42].begin.y;
      iVar18 = inter_arr->_M_elems[lVar42].begin.x;
      lVar44 = (long)iVar18;
      puVar25 = type_arr->_M_elems[lVar42].p;
      lVar26 = lVar44 * 8 + (long)iVar8 * -8;
      iVar30 = iVar10;
      do {
        if (iVar17 < iVar13) {
          iVar35 = iVar30 + 1;
          lVar28 = (iVar30 - iVar10) * lVar24;
          lVar33 = (iVar30 - iVar9) * lVar39;
          lVar41 = (long)iVar17;
          do {
            if (iVar18 < iVar12) {
              lVar31 = (lVar41 - iVar17) * lVar23;
              iVar38 = (int)lVar41 + 1;
              lVar37 = (lVar41 - lVar40) * lVar36;
              lVar27 = lVar37 + lVar33 + lVar44 * 8 + (long)iVar8 * -8 + 8;
              lVar43 = 0;
              lVar45 = lVar44;
              do {
                if (*(int *)((long)puVar25 +
                            lVar43 * 4 +
                            (lVar41 - iVar15) * lVar20 * 4 +
                            (long)(iVar30 - iVar14) * lVar21 * 4 + lVar44 * 4 + (long)iVar16 * -4)
                    == 2) {
                  dVar7 = *(double *)((long)pdVar19 + lVar43 * 8 + lVar27 + -8);
                  bVar32 = !NAN(pdVar22[lVar28 + lVar31 + lVar43]);
                  bVar34 = (dVar7 <= 0.0 || bVar32) && dVar7 != 0.0;
                  if ((int)lVar42 == 1) {
                    RVar46 = RVar5;
                    iVar29 = (int)lVar41;
                    RVar47 = RVar2;
                    if (bVar34) {
                      dVar7 = *(double *)
                               ((long)pdVar19 +
                               lVar43 * 8 + ((lVar41 + 1) - lVar40) * lVar36 + lVar33 + lVar26);
                      iVar29 = iVar38;
                      if ((dVar7 != 0.0) || (NAN(dVar7))) {
                        bVar32 = dVar7 <= 0.0 || bVar32;
                        goto LAB_00648376;
                      }
                    }
                  }
                  else if ((int)lVar42 == 0) {
                    RVar46 = RVar4;
                    RVar47 = RVar1;
                    if ((dVar7 <= 0.0 || bVar32) && dVar7 != 0.0) {
                      iVar29 = (int)lVar45 + 1;
                      dVar7 = *(double *)((long)pdVar19 + lVar43 * 8 + lVar27);
                      if ((dVar7 != 0.0) || (NAN(dVar7))) {
                        bVar32 = dVar7 <= 0.0 || bVar32;
LAB_00648376:
                        if (bVar32) goto LAB_006483a6;
                      }
                    }
                    else {
                      iVar29 = iVar18 + (int)lVar43;
                    }
                  }
                  else {
                    RVar46 = RVar6;
                    iVar29 = iVar30;
                    RVar47 = RVar3;
                    if (bVar34) {
                      dVar7 = *(double *)
                               ((long)pdVar19 +
                               lVar43 * 8 + lVar37 + (iVar35 - iVar9) * lVar39 + lVar26);
                      iVar29 = iVar35;
                      if ((dVar7 != 0.0) || (NAN(dVar7))) {
                        bVar32 = dVar7 <= 0.0 || bVar32;
                        goto LAB_00648376;
                      }
                    }
                  }
                  pdVar22[lVar28 + lVar31 + lVar43] = (double)iVar29 * RVar47 + RVar46;
                }
LAB_006483a6:
                lVar45 = lVar45 + 1;
                lVar43 = lVar43 + 1;
              } while (iVar12 - iVar18 != (int)lVar43);
            }
            lVar41 = lVar41 + 1;
          } while (iVar13 != (int)lVar41);
        }
        iVar30 = iVar30 + 1;
      } while (iVar30 != iVar11);
    }
    lVar42 = lVar42 + 1;
    if (lVar42 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void
STLtools::updateIntercept (Array<Array4<Real>,AMREX_SPACEDIM> const& inter_arr,
                           Array<Array4<EB2::Type_t const>,AMREX_SPACEDIM> const& type_arr,
                           Array4<Real const> const& lst, Geometry const& geom) const
{
    auto const& dx = geom.CellSizeArray();
    auto const& problo = geom.ProbLoArray();
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        Array4<Real> const& inter = inter_arr[idim];
        Array4<EB2::Type_t const> const& type = type_arr[idim];
        const Box bx{inter};
        amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k)
        {
            if (type(i,j,k) == EB2::Type::irregular) {
                bool is_nan = amrex::isnan(inter(i,j,k));
                if (idim == 0) {
                    if (lst(i,j,k) == Real(0.0) ||
                        (lst(i,j,k) > Real(0.0) && is_nan))
                    {
                        // interp might still be quiet_nan because lst that
                        // was set to zero has been changed by FillBoundary
                        // at periodic bounadries.
                        inter(i,j,k) = problo[0] + i*dx[0];
                    }
                    else if (lst(i+1,j,k) == Real(0.0) ||
                             (lst(i+1,j,k) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[0] + (i+1)*dx[0];
                    }
                } else if (idim == 1) {
                    if (lst(i,j,k) == Real(0.0) ||
                        (lst(i,j,k) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[1] + j*dx[1];
                    }
                    else if (lst(i,j+1,k) == Real(0.0) ||
                             (lst(i,j+1,k) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[1] + (j+1)*dx[1];
                    }
                } else {
                    if (lst(i,j,k) == Real(0.0) ||
                        (lst(i,j,k) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[2] + k*dx[2];
                        }
                    else if (lst(i,j,k+1) == Real(0.0) ||
                             (lst(i,j,k+1) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[2] + (k+1)*dx[2];
                    }
                }
            }
        });
    }
}